

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O1

void __thiscall SkipList::~SkipList(SkipList *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  pointer pcVar3;
  
  reset(this);
  pNVar2 = this->head;
  if (pNVar2 != (Node *)0x0) {
    pcVar3 = (pNVar2->value)._M_dataplus._M_p;
    paVar1 = &(pNVar2->value).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pNVar2,0x38);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

SkipList::~SkipList() {
  reset();
  delete head;
}